

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void __thiscall
cs::method_import::preprocess
          (method_import *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  iterator *piVar1;
  token_base *ptVar2;
  value_type ptVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Elt_pointer pdVar6;
  _Elt_pointer ppsVar7;
  int iVar8;
  const_reference pptVar9;
  token_base **pptVar10;
  tree_node *ptVar11;
  internal_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Elt_pointer pptVar12;
  value_type ptVar13;
  value_type ptVar14;
  tree_type<cs::token_base_*> *t;
  value_type t_00;
  size_t sVar15;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  var_list;
  anon_class_16_2_05505a5e process;
  iterator local_90;
  undefined1 local_88 [32];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  local_68;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *local_50;
  method_import *local_48;
  anon_class_16_2_05505a5e local_40;
  
  ptVar13 = (value_type)0x1;
  local_50 = raw;
  local_48 = this;
  pptVar9 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar14 = *pptVar9;
  local_88._0_8_ = ptVar14[1]._vptr_token_base;
  pptVar10 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_88);
  if (*pptVar10 == (token_base *)0x0) {
    this_00 = (internal_error *)__cxa_allocate_exception(0x28);
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Null pointer accessed.","");
    internal_error::internal_error(this_00,(string *)local_88);
    __cxa_throw(this_00,&internal_error::typeinfo,internal_error::~internal_error);
  }
  ptVar14 = ptVar14 + 1;
  local_88._0_8_ = (tree_node *)0x0;
  local_88._8_8_ = (pointer)0x0;
  local_88._16_8_ = (pointer)0x0;
  local_90.mData = (tree_node *)ptVar14->_vptr_token_base;
  local_40.context = context;
  local_40.var_list =
       (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
        *)local_88;
  pptVar10 = tree_type<cs::token_base_*>::iterator::data(&local_90);
  iVar8 = (*(*pptVar10)->_vptr_token_base[2])();
  if (iVar8 == 0xf) {
    local_90.mData = (tree_node *)ptVar14->_vptr_token_base;
    pptVar10 = tree_type<cs::token_base_*>::iterator::data(&local_90);
    ptVar2 = *pptVar10;
    t_00 = (value_type)ptVar2[2]._vptr_token_base;
    ptVar3 = (value_type)ptVar2[4]._vptr_token_base;
    ptVar14 = ptVar13;
    if (t_00 != ptVar3) {
      ptVar13 = (value_type)ptVar2[3]._vptr_token_base;
      sVar15 = ptVar2[3].line_num;
      do {
        ptVar14 = t_00;
        preprocess::anon_class_16_2_05505a5e::operator()
                  (&local_40,(tree_type<cs::token_base_*> *)t_00);
        t_00 = (value_type)&t_00->line_num;
        if (t_00 == ptVar13) {
          t_00 = *(value_type *)(sVar15 + 8);
          sVar15 = sVar15 + 8;
          ptVar13 = t_00 + 0x20;
        }
      } while (t_00 != ptVar3);
    }
  }
  else {
    preprocess::anon_class_16_2_05505a5e::operator()
              (&local_40,(tree_type<cs::token_base_*> *)ptVar14);
  }
  ptVar11 = (tree_node *)statement_base::operator_new((statement_base *)0x38,(size_t)ptVar14);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  ::vector(&local_68,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
            *)local_88);
  peVar4 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var5 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  pdVar6 = (local_50->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar12 = (pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pptVar12 ==
      (pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pptVar12 = (pdVar6->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ptVar2 = pptVar12[-1];
  ptVar11->root = (tree_node *)&PTR__statement_base_00251d78;
  (((context_t *)&ptVar11->left)->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = peVar4;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ptVar11->right)->_M_pi = p_Var5;
  ptVar11->data = (token_base *)ptVar2->line_num;
  ptVar11->root = (tree_node *)&PTR__statement_import_00257360;
  ptVar11[1].root =
       (tree_node *)
       local_68.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (((context_t *)&ptVar11[1].left)->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = (element_type *)
             local_68.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ptVar11[1].right)->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_68.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppsVar7 = (local_48->mResult).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  local_90.mData = ptVar11;
  if (ppsVar7 ==
      (local_48->mResult).
      super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
    _M_push_back_aux<cs::statement_import*>
              ((deque<cs::statement_base*,std::allocator<cs::statement_base*>> *)&local_48->mResult,
               (statement_import **)&local_90);
  }
  else {
    *ppsVar7 = (statement_base *)ptVar11;
    piVar1 = &(local_48->mResult).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  ::~vector(&local_68);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
             *)local_88);
  return;
}

Assistant:

void method_import::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (tree.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		std::vector<std::pair<std::string, var>> var_list;
		auto process = [&context, &var_list](tree_type<token_base *> &t) {
			token_base *token = t.root().data();
			if (token == nullptr || token->get_type() != token_types::id)
				throw compile_error("Wrong grammar for import statement, expect <package name>");
			const var_id &package_name = static_cast<token_id *>(token)->get_id();
			const var &ext = make_namespace(context->instance->import(current_process->import_path, package_name));
			context->compiler->add_constant(ext);
			context->instance->storage.add_var_no_return(package_name, ext);
			var_list.emplace_back(package_name, ext);
		};
		if (tree.root().data()->get_type() == token_types::parallel) {
			auto &parallel_list = static_cast<token_parallel *>(tree.root().data())->get_parallel();
			for (auto &t: parallel_list)
				process(t);
		}
		else
			process(tree);
		mResult.emplace_back(new statement_import(var_list, context, raw.front().back()));
	}